

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O2

void duckdb::DuckDBConstraintsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TableCatalogEntry *this;
  pointer pLVar2;
  pointer pbVar3;
  size_type sVar4;
  pointer pbVar5;
  GlobalTableFunctionState *pGVar6;
  reference pvVar7;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *this_00;
  const_reference this_01;
  pointer pCVar8;
  UniqueConstraint *this_02;
  ForeignKeyConstraint *pFVar9;
  string *psVar10;
  idx_t val;
  long lVar11;
  type constraint;
  TableCatalogEntry *table;
  iterator iVar12;
  CheckConstraint *pCVar13;
  pointer pPVar14;
  _func_int **pp_Var15;
  NotImplementedException *this_03;
  _func_int **pp_Var16;
  _func_int **pp_Var17;
  ExtraConstraintInfo *in_R8;
  unsigned_long __val;
  pointer pbVar18;
  pointer pbVar19;
  pointer pLVar20;
  ulong local_3e0;
  vector<duckdb::Value,_true> referenced_column_name_list;
  vector<duckdb::Value,_true> column_name_list;
  string constraint_name;
  LogicalType local_350;
  string constraint_type;
  vector<duckdb::Value,_true> column_index_list;
  ExtraConstraintInfo info;
  string local_278;
  string local_258;
  Value expression_text;
  vector<duckdb::Value,_true> local_1f8;
  vector<duckdb::Value,_true> local_1d8;
  vector<duckdb::Value,_true> local_1b8;
  Value local_1a0;
  LogicalType local_160;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  LogicalType local_88;
  string local_70;
  string local_50;
  
  pGVar6 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  pp_Var17 = pGVar6[4]._vptr_GlobalTableFunctionState;
  pp_Var15 = pGVar6[1]._vptr_GlobalTableFunctionState;
  pp_Var16 = pGVar6[2]._vptr_GlobalTableFunctionState;
  if (pp_Var17 < (_func_int **)((long)pp_Var16 - (long)pp_Var15 >> 5)) {
    local_3e0 = 0;
    while ((pp_Var17 < (_func_int **)((long)pp_Var16 - (long)pp_Var15 >> 5) && (local_3e0 < 0x800)))
    {
      pvVar7 = vector<duckdb::ConstraintEntry,_true>::get<true>
                         ((vector<duckdb::ConstraintEntry,_true> *)(pGVar6 + 1),(size_type)pp_Var17)
      ;
      this = pvVar7->table;
      this_00 = TableCatalogEntry::GetConstraints(this);
      pp_Var15 = pGVar6[5]._vptr_GlobalTableFunctionState;
      while ((pp_Var16 = (_func_int **)
                         ((long)(this_00->
                                super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this_00->
                                super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3), pp_Var15 < pp_Var16
             && (local_3e0 < 0x800))) {
        this_01 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                  ::get<true>(this_00,(size_type)pp_Var15);
        constraint_type._M_dataplus._M_p = (pointer)&constraint_type.field_2;
        constraint_type._M_string_length = 0;
        constraint_type.field_2._M_local_buf[0] = '\0';
        pCVar8 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_01);
        switch(pCVar8->type) {
        case NOT_NULL:
        case CHECK:
          ::std::__cxx11::string::assign((char *)&constraint_type);
          break;
        case UNIQUE:
          pCVar8 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_01);
          this_02 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar8);
          UniqueConstraint::IsPrimaryKey(this_02);
          ::std::__cxx11::string::assign((char *)&constraint_type);
          break;
        case FOREIGN_KEY:
          pCVar8 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_01);
          pFVar9 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar8);
          if ((pFVar9->info).type != FK_TYPE_PRIMARY_KEY_TABLE) {
            ::std::__cxx11::string::assign((char *)&constraint_type);
            break;
          }
          goto LAB_008567cb;
        default:
          this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&info,"Unimplemented constraint for duckdb_constraints",
                     (allocator *)&expression_text);
          NotImplementedException::NotImplementedException(this_03,(string *)&info);
          __cxa_throw(this_03,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        psVar10 = Catalog::GetName_abi_cxx11_
                            ((((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
        ::std::__cxx11::string::string((string *)&local_a8,(string *)psVar10);
        Value::Value((Value *)&info,&local_a8);
        DataChunk::SetValue(output,0,local_3e0,(Value *)&info);
        Value::~Value((Value *)&info);
        ::std::__cxx11::string::~string((string *)&local_a8);
        val = Catalog::GetOid((((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
        lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
        Value::BIGINT((Value *)&info,lVar11);
        DataChunk::SetValue(output,1,local_3e0,(Value *)&info);
        Value::~Value((Value *)&info);
        ::std::__cxx11::string::string
                  ((string *)&local_c8,
                   (string *)
                   &(((this->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.
                    name);
        Value::Value((Value *)&info,&local_c8);
        DataChunk::SetValue(output,2,local_3e0,(Value *)&info);
        Value::~Value((Value *)&info);
        ::std::__cxx11::string::~string((string *)&local_c8);
        lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((((this->super_StandardEntry).schema)->super_InCatalogEntry).
                            super_CatalogEntry.oid);
        Value::BIGINT((Value *)&info,lVar11);
        DataChunk::SetValue(output,3,local_3e0,(Value *)&info);
        Value::~Value((Value *)&info);
        ::std::__cxx11::string::string
                  ((string *)&local_e8,
                   (string *)
                   &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
        Value::Value((Value *)&info,&local_e8);
        DataChunk::SetValue(output,4,local_3e0,(Value *)&info);
        Value::~Value((Value *)&info);
        ::std::__cxx11::string::~string((string *)&local_e8);
        lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid)
        ;
        Value::BIGINT((Value *)&info,lVar11);
        DataChunk::SetValue(output,5,local_3e0,(Value *)&info);
        Value::~Value((Value *)&info);
        constraint = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                     operator*(this_01);
        GetExtraConstraintInfo(&info,this,constraint);
        table = (TableCatalogEntry *)
                unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator*(this_01);
        GetConstraintName_abi_cxx11_
                  (&constraint_name,(duckdb *)this,table,(Constraint *)&info,in_R8);
        iVar12 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)(pGVar6 + 7),&constraint_name);
        if (iVar12.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          __val = 2;
          while( true ) {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1a0,&constraint_name,"_");
            ::std::__cxx11::to_string((string *)&column_index_list,__val);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &expression_text,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1a0,(string *)&column_index_list);
            iVar12 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)(pGVar6 + 7),(key_type *)&expression_text);
            ::std::__cxx11::string::~string((string *)&expression_text);
            ::std::__cxx11::string::~string((string *)&column_index_list);
            ::std::__cxx11::string::~string((string *)&local_1a0);
            if (iVar12.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) break;
            __val = __val + 1;
          }
          ::std::__cxx11::to_string((string *)&local_1a0,__val);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &expression_text,"_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a0);
          ::std::__cxx11::string::append((string *)&constraint_name);
          ::std::__cxx11::string::~string((string *)&expression_text);
          ::std::__cxx11::string::~string((string *)&local_1a0);
        }
        pp_Var17 = pGVar6[6]._vptr_GlobalTableFunctionState;
        pGVar6[6]._vptr_GlobalTableFunctionState = (_func_int **)((long)pp_Var17 + 1);
        lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)pp_Var17);
        Value::BIGINT(&expression_text,lVar11);
        DataChunk::SetValue(output,6,local_3e0,&expression_text);
        Value::~Value(&expression_text);
        ::std::__cxx11::string::string((string *)&local_108,(string *)&constraint_type);
        Value::Value(&expression_text,&local_108);
        DataChunk::SetValue(output,7,local_3e0,&expression_text);
        Value::~Value(&expression_text);
        ::std::__cxx11::string::~string((string *)&local_108);
        pCVar8 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_01);
        (*pCVar8->_vptr_Constraint[2])(&local_128,pCVar8);
        Value::Value(&expression_text,&local_128);
        DataChunk::SetValue(output,8,local_3e0,&expression_text);
        Value::~Value(&expression_text);
        ::std::__cxx11::string::~string((string *)&local_128);
        LogicalType::LogicalType(&local_88,SQLNULL);
        Value::Value(&expression_text,&local_88);
        LogicalType::~LogicalType(&local_88);
        pCVar8 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_01);
        if (pCVar8->type == CHECK) {
          pCVar8 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_01);
          pCVar13 = Constraint::Cast<duckdb::CheckConstraint>(pCVar8);
          pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(&pCVar13->expression);
          (*(pPVar14->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar14);
          Value::Value(&local_1a0,&local_50);
          Value::operator=(&expression_text,&local_1a0);
          Value::~Value(&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        DataChunk::SetValue(output,9,local_3e0,&expression_text);
        pLVar2 = info.column_indexes.
                 super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (pLVar20 = info.column_indexes.
                       super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                       super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar3 = info.column_names.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            pbVar18 = info.column_names.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pLVar20 != pLVar2;
            pLVar20 = pLVar20 + 1) {
          Value::UBIGINT(&local_1a0,pLVar20->index);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&column_index_list,
                     &local_1a0);
          Value::~Value(&local_1a0);
        }
        for (; pbVar5 = info.referenced_columns.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            pbVar19 = info.referenced_columns.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pbVar18 != pbVar3;
            pbVar18 = pbVar18 + 1) {
          ::std::__cxx11::string::string((string *)&local_70,(string *)pbVar18);
          Value::Value(&local_1a0,&local_70);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&column_name_list,
                     &local_1a0);
          Value::~Value(&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_70);
        }
        for (; pbVar19 != pbVar5; pbVar19 = pbVar19 + 1) {
          ::std::__cxx11::string::string((string *)&local_148,(string *)pbVar19);
          Value::Value(&local_1a0,&local_148);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                     &referenced_column_name_list,&local_1a0);
          Value::~Value(&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_148);
        }
        LogicalType::LogicalType(&local_350,BIGINT);
        local_1b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start =
             column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish =
             column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        column_index_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Value::LIST(&local_1a0,&local_350,&local_1b8);
        DataChunk::SetValue(output,10,local_3e0,&local_1a0);
        Value::~Value(&local_1a0);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1b8);
        LogicalType::~LogicalType(&local_350);
        LogicalType::LogicalType(&local_350,VARCHAR);
        local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start =
             column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish =
             column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Value::LIST(&local_1a0,&local_350,&local_1d8);
        DataChunk::SetValue(output,0xb,local_3e0,&local_1a0);
        Value::~Value(&local_1a0);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1d8);
        LogicalType::~LogicalType(&local_350);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)constraint_name._M_dataplus._M_p == &constraint_name.field_2) {
          local_258.field_2._8_8_ = constraint_name.field_2._8_8_;
        }
        else {
          local_258._M_dataplus._M_p = constraint_name._M_dataplus._M_p;
        }
        local_258.field_2._M_allocated_capacity._1_7_ =
             constraint_name.field_2._M_allocated_capacity._1_7_;
        local_258.field_2._M_local_buf[0] = constraint_name.field_2._M_local_buf[0];
        local_258._M_string_length = constraint_name._M_string_length;
        constraint_name._M_string_length = 0;
        constraint_name.field_2._M_local_buf[0] = '\0';
        constraint_name._M_dataplus._M_p = (pointer)&constraint_name.field_2;
        Value::Value(&local_1a0,&local_258);
        DataChunk::SetValue(output,0xc,local_3e0,&local_1a0);
        Value::~Value(&local_1a0);
        ::std::__cxx11::string::~string((string *)&local_258);
        sVar4 = info.referenced_table._M_string_length;
        if (info.referenced_table._M_string_length == 0) {
          LogicalType::LogicalType(&local_160,SQLNULL);
          Value::Value(&local_1a0,&local_160);
        }
        else {
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          paVar1 = &info.referenced_table.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)info.referenced_table._M_dataplus._M_p == paVar1) {
            local_278.field_2._8_8_ = info.referenced_table.field_2._8_8_;
          }
          else {
            local_278._M_dataplus._M_p = info.referenced_table._M_dataplus._M_p;
          }
          local_278.field_2._M_allocated_capacity._1_7_ =
               info.referenced_table.field_2._M_allocated_capacity._1_7_;
          local_278.field_2._M_local_buf[0] = info.referenced_table.field_2._M_local_buf[0];
          local_278._M_string_length = info.referenced_table._M_string_length;
          info.referenced_table._M_string_length = 0;
          info.referenced_table.field_2._M_local_buf[0] = '\0';
          info.referenced_table._M_dataplus._M_p = (pointer)paVar1;
          Value::Value(&local_1a0,&local_278);
        }
        DataChunk::SetValue(output,0xd,local_3e0,&local_1a0);
        Value::~Value(&local_1a0);
        if (sVar4 == 0) {
          LogicalType::~LogicalType(&local_160);
        }
        else {
          ::std::__cxx11::string::~string((string *)&local_278);
        }
        LogicalType::LogicalType(&local_350,VARCHAR);
        local_1f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start =
             referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
             .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish =
             referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
             .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
             .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        referenced_column_name_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Value::LIST(&local_1a0,&local_350,&local_1f8);
        DataChunk::SetValue(output,0xe,local_3e0,&local_1a0);
        Value::~Value(&local_1a0);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1f8);
        LogicalType::~LogicalType(&local_350);
        local_3e0 = local_3e0 + 1;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                   &referenced_column_name_list);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&column_name_list);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&column_index_list);
        Value::~Value(&expression_text);
        ::std::__cxx11::string::~string((string *)&constraint_name);
        ExtraConstraintInfo::~ExtraConstraintInfo(&info);
LAB_008567cb:
        ::std::__cxx11::string::~string((string *)&constraint_type);
        pp_Var15 = (_func_int **)((long)pGVar6[5]._vptr_GlobalTableFunctionState + 1);
        pGVar6[5]._vptr_GlobalTableFunctionState = pp_Var15;
      }
      pp_Var17 = pGVar6[4]._vptr_GlobalTableFunctionState;
      if (pp_Var16 <= pp_Var15) {
        pGVar6[5]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
        pp_Var17 = (_func_int **)((long)pp_Var17 + 1);
        pGVar6[4]._vptr_GlobalTableFunctionState = pp_Var17;
      }
      pp_Var15 = pGVar6[1]._vptr_GlobalTableFunctionState;
      pp_Var16 = pGVar6[2]._vptr_GlobalTableFunctionState;
    }
    output->count = local_3e0;
  }
  return;
}

Assistant:

void DuckDBConstraintsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBConstraintsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		auto &table = entry.table;
		auto &constraints = table.GetConstraints();
		for (; data.constraint_offset < constraints.size() && count < STANDARD_VECTOR_SIZE; data.constraint_offset++) {
			auto &constraint = constraints[data.constraint_offset];
			// return values:
			// constraint_type, VARCHAR
			// Processing this first due to shortcut (early continue)
			string constraint_type;
			switch (constraint->type) {
			case ConstraintType::CHECK:
				constraint_type = "CHECK";
				break;
			case ConstraintType::UNIQUE: {
				auto &unique = constraint->Cast<UniqueConstraint>();
				constraint_type = unique.IsPrimaryKey() ? "PRIMARY KEY" : "UNIQUE";
				break;
			}
			case ConstraintType::NOT_NULL:
				constraint_type = "NOT NULL";
				break;
			case ConstraintType::FOREIGN_KEY: {
				auto &fk = constraint->Cast<ForeignKeyConstraint>();
				if (fk.info.type == ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE) {
					// Those are already covered by PRIMARY KEY and UNIQUE entries
					continue;
				}
				constraint_type = "FOREIGN KEY";
				break;
			}
			default:
				throw NotImplementedException("Unimplemented constraint for duckdb_constraints");
			}

			idx_t col = 0;
			// database_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.schema.catalog.GetName()));
			// database_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.schema.catalog.GetOid())));
			// schema_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.schema.name));
			// schema_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.schema.oid)));
			// table_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.name));
			// table_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.oid)));

			auto info = GetExtraConstraintInfo(table, *constraint);
			auto constraint_name = GetConstraintName(table, *constraint, info);
			if (data.constraint_names.find(constraint_name) != data.constraint_names.end()) {
				// duplicate constraint name
				idx_t index = 2;
				while (data.constraint_names.find(constraint_name + "_" + to_string(index)) !=
				       data.constraint_names.end()) {
					index++;
				}
				constraint_name += "_" + to_string(index);
			}
			// constraint_index, BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(data.unique_constraint_offset++)));

			// constraint_type, VARCHAR
			output.SetValue(col++, count, Value(constraint_type));

			// constraint_text, VARCHAR
			output.SetValue(col++, count, Value(constraint->ToString()));

			// expression, VARCHAR
			Value expression_text;
			if (constraint->type == ConstraintType::CHECK) {
				auto &check = constraint->Cast<CheckConstraint>();
				expression_text = Value(check.expression->ToString());
			}
			output.SetValue(col++, count, expression_text);

			vector<Value> column_index_list;
			vector<Value> column_name_list;
			vector<Value> referenced_column_name_list;
			for (auto &col_index : info.column_indexes) {
				column_index_list.push_back(Value::UBIGINT(col_index.index));
			}
			for (auto &name : info.column_names) {
				column_name_list.push_back(Value(std::move(name)));
			}
			for (auto &name : info.referenced_columns) {
				referenced_column_name_list.push_back(Value(std::move(name)));
			}
			// constraint_column_indexes, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::BIGINT, std::move(column_index_list)));

			// constraint_column_names, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, std::move(column_name_list)));

			// constraint_name, VARCHAR
			output.SetValue(col++, count, Value(std::move(constraint_name)));

			// referenced_table, VARCHAR
			output.SetValue(col++, count,
			                info.referenced_table.empty() ? Value() : Value(std::move(info.referenced_table)));

			// referenced_column_names, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, std::move(referenced_column_name_list)));
			count++;
		}

		if (data.constraint_offset >= constraints.size()) {
			data.constraint_offset = 0;
			data.offset++;
		}
	}
	output.SetCardinality(count);
}